

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::init(ClearCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppDVar1;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar2;
  ostringstream *this_00;
  pointer pDVar3;
  pointer pVVar4;
  Context *pCVar5;
  RenderContext *pRVar6;
  undefined8 uVar7;
  pointer pbVar8;
  TestContext *pTVar9;
  bool bVar10;
  ContextType ctxType;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  uint uVar14;
  ShaderProgram *pSVar15;
  undefined4 extraout_var;
  ObjectWrapper *this_01;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ulong uVar16;
  pointer pDVar17;
  Context *pCVar18;
  pointer pbVar19;
  ContextInfo *pCVar20;
  TestLog *pTVar21;
  NotSupportedError *pNVar22;
  TestError *pTVar23;
  ulong uVar24;
  ClearCase *code;
  bool setBBox;
  bool setBBox_00;
  bool *pbVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  ulong uVar29;
  size_t __n;
  char *pcVar30;
  float fVar31;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  float fVar32;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_2;
  Random rnd;
  undefined1 local_3f8 [4];
  float fStack_3f4;
  undefined1 auStack_3f0 [8];
  undefined1 local_3e8 [24];
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  Context *local_3a8;
  TestContext *local_3a0;
  Context local_398;
  TestContext *local_380;
  undefined1 local_378 [48];
  undefined8 local_348;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  pointer local_320;
  value_type local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  TestContext *local_278;
  undefined1 local_270 [32];
  uint local_250;
  value_type local_248;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  long local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  ios_base local_150 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  undefined1 local_118 [208];
  undefined8 local_48;
  undefined8 uStack_40;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar10 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar10) {
    bVar10 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_primitive_bounding_box");
    if (!bVar10) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_1c8);
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_drawTriangles == true) &&
       (bVar10 = glu::ContextInfo::isExtensionSupported
                           (((this->super_TestCase).m_context)->m_contextInfo,
                            "GL_EXT_tessellation_shader"), !bVar10)) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Test requires GL_EXT_tessellation_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_1c8);
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pbVar25 = &this->m_drawTriangles;
  local_1c8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Doing multiple",0xe);
  pcVar28 = " scissored";
  pcVar30 = glcts::fixed_sample_locations_values + 1;
  bVar10 = this->m_scissoredClear == false;
  if (bVar10) {
    pcVar28 = glcts::fixed_sample_locations_values + 1;
  }
  lVar27 = 10;
  if (bVar10) {
    lVar27 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar28,lVar27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," color buffer clears",0x14)
  ;
  pcVar28 = " and drawing some geometry between them";
  if (*pbVar25 == false) {
    pcVar28 = glcts::fixed_sample_locations_values + 1;
  }
  lVar27 = 0x27;
  if (*pbVar25 == false) {
    lVar27 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar28,lVar27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  pcVar28 = "Setting scissor area to cover entire viewport.\n";
  bVar10 = (this->m_scissoredClear & this->m_fullscreenScissor) == 0;
  if (bVar10) {
    pcVar28 = glcts::fixed_sample_locations_values + 1;
  }
  lVar27 = 0x2f;
  if (bVar10) {
    lVar27 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar28,lVar27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Rendering with and without setting the bounding box.\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Expecting bounding box to have no effect on clears (i.e. results are constant).\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Set bounding box using ",0x17);
  pcVar28 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar28 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar28,(ulong)this->m_useGlobalState * 8 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Clear color is green with yellowish shades.\n",0x2c);
  if (*pbVar25 != false) {
    pcVar30 = "Primitive color is yellow with greenish shades.\n";
  }
  lVar27 = 0x30;
  if (*pbVar25 == false) {
    lVar27 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar30,lVar27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  pSVar15 = (ShaderProgram *)std::ios_base::~ios_base(local_150);
  if (*pbVar25 == true) {
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                          _M_p);
    deRandom_init((deRandom *)local_1c8,dVar12);
    this_01 = (ObjectWrapper *)operator_new(0x18);
    iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(this_01,(Functions *)CONCAT44(extraout_var_00,iVar13),traits);
    local_3f8 = (undefined1  [4])0x0;
    fStack_3f4 = 0.0;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != this_01) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&(this->m_vbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this->m_vbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_01;
    }
    local_1e0 = CONCAT44(extraout_var,iVar11);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_3f8);
    uVar24 = 0;
    local_48 = 0x3e4cccd03fb33333;
    uStack_40 = 0;
    do {
      local_1d0 = uVar24;
      dVar12 = deRandom_getUint32((deRandom *)local_1c8);
      local_338 = deRandom_getFloat((deRandom *)local_1c8);
      fStack_334 = extraout_XMM0_Db;
      fVar31 = deRandom_getFloat((deRandom *)local_1c8);
      fStack_330 = fStack_334 + fStack_334;
      local_338 = local_338 + local_338 + -1.2;
      fStack_334 = fVar31 + fVar31 + -1.2;
      fStack_330 = fStack_330 + 0.0;
      fStack_32c = extraout_XMM0_Db_00 + extraout_XMM0_Db_00 + 0.0;
      local_228 = deRandom_getFloat((deRandom *)local_1c8);
      fStack_224 = extraout_XMM0_Db_01;
      fVar31 = deRandom_getFloat((deRandom *)local_1c8);
      fStack_220 = fStack_224 * 0.0;
      fVar32 = local_228 * 0.8 + 0.2;
      fStack_224 = fVar31 * 0.8 + 0.2;
      fStack_220 = fStack_220 + 0.0;
      fStack_21c = extraout_XMM0_Db_02 * 0.0 + 0.0;
      pDVar17 = (this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar26 = (ulong)((long)(this->m_objectVertices).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_objectVertices).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
      uVar24 = (ulong)((dVar12 & 3) * 3 + 3);
      if (pDVar17 ==
          (this->m_drawObjects).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pDVar3 = (this->m_drawObjects).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)pDVar17 - (long)pDVar3;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar29 = (long)__n >> 3;
        uVar16 = uVar29;
        if (pDVar17 == pDVar3) {
          uVar16 = 1;
        }
        local_1f8 = uVar16 + uVar29;
        if (0xffffffffffffffe < local_1f8) {
          local_1f8 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar16,uVar29)) {
          local_1f8 = 0xfffffffffffffff;
        }
        local_348 = (ShaderProgram *)pDVar3;
        if (local_1f8 == 0) {
          pDVar17 = (pointer)0x0;
          local_228 = fVar32;
        }
        else {
          local_228 = fVar32;
          local_208 = uVar24;
          local_1d8 = uVar29;
          pDVar17 = (pointer)operator_new(local_1f8 * 8);
          uVar24 = local_208;
          uVar29 = local_1d8;
        }
        pDVar17[uVar29] = (DrawObject)(uVar26 & 0xffffffff | uVar24 << 0x20);
        if (0 < (long)__n) {
          memmove(pDVar17,local_348,__n);
        }
        pDVar3 = (pointer)local_348;
        if (local_348 != (ShaderProgram *)0x0) {
          uVar24 = (long)(this->m_drawObjects).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_348;
          local_348 = (ShaderProgram *)pDVar17;
          operator_delete(pDVar3,uVar24);
          pDVar17 = (pointer)local_348;
        }
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar17;
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pDVar17 + __n + 8);
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar17 + local_1f8;
      }
      else {
        uVar24 = uVar26 & 0xffffffff | uVar24 << 0x20;
        pDVar17->firstNdx = (int)uVar24;
        pDVar17->numVertices = (int)(uVar24 >> 0x20);
        ppDVar1 = &(this->m_drawObjects).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
        local_228 = fVar32;
      }
      local_228 = (local_228 + local_338) - local_338;
      fStack_224 = (fStack_224 + fStack_334) - fStack_334;
      fStack_220 = (fStack_220 + fStack_330) - fStack_330;
      fStack_21c = (fStack_21c + fStack_32c) - fStack_32c;
      fStack_330 = -0.7;
      fStack_32c = 0.9;
      uVar14 = 0;
      do {
        iVar11 = 3;
        do {
          fVar31 = deRandom_getFloat((deRandom *)local_1c8);
          local_348 = (ShaderProgram *)CONCAT44(extraout_XMM0_Db_03,fVar31);
          fVar31 = deRandom_getFloat((deRandom *)local_1c8);
          local_1f8 = CONCAT44(extraout_XMM0_Db_04,fVar31);
          fVar31 = deRandom_getFloat((deRandom *)local_1c8);
          local_208 = CONCAT44(extraout_XMM0_Db_05,fVar31);
          fVar31 = deRandom_getFloat((deRandom *)local_1c8);
          local_3f8 = (undefined1  [4])((float)local_348 * local_228 + local_338);
          fStack_3f4 = (float)local_1f8 * fStack_224 + fStack_334;
          auStack_3f0._4_4_ = (float)((ulong)local_48 >> 0x20) * fVar31 + fStack_32c;
          auStack_3f0._0_4_ = (float)local_48 * (float)local_208 + fStack_330;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                     &this->m_objectVertices,(Vector<float,_4> *)local_3f8);
          lVar27 = local_1e0;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        bVar10 = uVar14 != (dVar12 & 3);
        uVar14 = uVar14 + 1;
      } while (bVar10);
      uVar14 = (int)local_1d0 + 1;
      uVar24 = (ulong)uVar14;
    } while (uVar14 != 0x10);
    (**(code **)(local_1e0 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    pVVar4 = (this->m_objectVertices).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar27 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_objectVertices).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar4) &
                      0xfffffffffffffff0,pVVar4,0x88e4);
    dVar12 = (**(code **)(lVar27 + 0x800))();
    glu::checkError(dVar12,"buffer upload",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x10df);
    pSVar15 = (ShaderProgram *)operator_new(0xd0);
    pCVar5 = (this->super_TestCase).m_context;
    pRVar6 = pCVar5->m_renderCtx;
    code = this;
    memset(local_1c8,0,0xac);
    local_118._0_8_ = (pointer)0x0;
    local_118[8] = 0;
    local_118._9_7_ = 0;
    local_118[0x10] = 0;
    local_118._17_8_ = 0;
    local_3a8 = &local_398;
    local_3d0._0_8_ = (TestContext *)0x102;
    pCVar18 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)local_3d0);
    uVar7 = local_3d0._0_8_;
    local_398.m_testCtx = (TestContext *)local_3d0._0_8_;
    local_3a8 = pCVar18;
    memcpy(pCVar18,
           "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
           ,0x102);
    local_3a0 = (TestContext *)uVar7;
    *(char *)((long)&pCVar18->m_testCtx + uVar7) = '\0';
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_298,(_anonymous_namespace_ *)pCVar5,local_3a8,(char *)code);
    _local_3f8 = (pointer)((ulong)(uint)fStack_3f4 << 0x20);
    auStack_3f0 = (undefined1  [8])(local_3e8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_3f0,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + ((ulong)_local_3f8 & 0xffffffff) * 0x18),(value_type *)auStack_3f0);
    pCVar5 = (this->super_TestCase).m_context;
    local_378._16_8_ = local_378 + 0x20;
    local_320 = (pointer)0x81;
    pbVar19 = (pointer)std::__cxx11::string::_M_create
                                 ((ulong *)(local_378 + 0x10),(ulong)&local_320);
    pbVar8 = local_320;
    local_378._32_8_ = local_320;
    local_378._16_8_ = pbVar19;
    memcpy(pbVar19,
           "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
           ,0x81);
    local_378._24_8_ = pbVar8;
    *(undefined1 *)((long)&(pbVar19->_M_dataplus)._M_p + (long)pbVar8) = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2b8,(_anonymous_namespace_ *)pCVar5,(Context *)local_378._16_8_,(char *)code);
    local_3d0._0_4_ = 1;
    local_3d0._8_8_ = local_3c0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3d0 + 8),local_2b8._M_dataplus._M_p,
               local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + (local_3d0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_3d0 + 8)
               );
    pCVar5 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
              ((string *)local_270,(void *)0x0,setBBox);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2d8,(_anonymous_namespace_ *)pCVar5,(Context *)local_270._0_8_,(char *)code);
    local_320 = (pointer)CONCAT44(local_320._4_4_,3);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,local_2d8._M_dataplus._M_p,
               local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + ((ulong)local_320 & 0xffffffff) * 0x18),&local_318);
    pCVar5 = (this->super_TestCase).m_context;
    local_398.m_contextInfo = (ContextInfo *)local_378;
    local_278 = (TestContext *)0x1f5;
    pCVar20 = (ContextInfo *)
              std::__cxx11::string::_M_create((ulong *)&local_398.m_contextInfo,(ulong)&local_278);
    pTVar9 = local_278;
    local_378._0_8_ = local_278;
    local_398.m_contextInfo = pCVar20;
    memcpy(pCVar20,
           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
           ,0x1f5);
    local_380 = pTVar9;
    *(undefined1 *)((long)&pCVar20->_vptr_ContextInfo + (long)pTVar9) = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2f8,(_anonymous_namespace_ *)pCVar5,(Context *)local_398.m_contextInfo,
               (char *)code);
    local_250 = 4;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_2f8._M_dataplus._M_p,
               local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + (ulong)local_250 * 0x18),&local_248);
    glu::ShaderProgram::ShaderProgram(pSVar15,pRVar6,(ProgramSources *)local_1c8);
    local_218.m_data.ptr = (ShaderProgram *)0x0;
    pMVar2 = &this->m_basicProgram;
    if ((this->m_basicProgram).
        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
        pSVar15) {
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&pMVar2->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
      (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data
      .ptr = pSVar15;
    }
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_398.m_contextInfo != (ContextInfo *)local_378) {
      operator_delete(local_398.m_contextInfo,(ulong)((long)(Platform **)local_378._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_270._0_8_ != (Context *)(local_270 + 0x10)) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    if ((char *)local_3d0._8_8_ != local_3c0._M_local_buf + 8) {
      operator_delete((void *)local_3d0._8_8_,
                      CONCAT17(local_3c0._M_local_buf[0xf],
                               CONCAT16(local_3c0._M_local_buf[0xe],local_3c0._8_6_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_378._16_8_ != (pointer)(local_378 + 0x20)) {
      operator_delete((void *)local_378._16_8_,
                      (ulong)((long)&((_Alloc_hider *)local_378._32_8_)->_M_p + 1));
    }
    if (auStack_3f0 != (undefined1  [8])(local_3e8 + 8)) {
      operator_delete((void *)auStack_3f0,local_3e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_138);
    lVar27 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + lVar27));
      lVar27 = lVar27 + -0x18;
    } while (lVar27 != -0x18);
    pTVar21 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    auStack_3f0 = (undefined1  [8])0x7;
    local_3e8._0_8_ = (Functions *)0x6d6172676f7250;
    local_3c0._M_allocated_capacity._0_6_ = 0x726564616853;
    pcVar28 = (char *)0x6d6172676f727020;
    local_3c0._M_allocated_capacity._6_2_ = 0x7020;
    local_3c0._8_6_ = 0x6d6172676f72;
    local_3d0._8_8_ = 0xe;
    local_3c0._M_local_buf[0xe] = '\0';
    _local_3f8 = (pointer)local_3e8;
    local_3d0._0_8_ = &local_3c0;
    tcu::LogSection::LogSection((LogSection *)local_1c8,(string *)local_3f8,(string *)local_3d0);
    tcu::TestLog::startSection(pTVar21,(char *)local_1c8._0_8_,local_1a8._M_p);
    pTVar21 = glu::operator<<(pTVar21,(pMVar2->
                                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                      ).m_data.ptr);
    tcu::TestLog::endSection(pTVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != local_198) {
      operator_delete(local_1a8._M_p,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != &local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != &local_3c0) {
      operator_delete((void *)local_3d0._0_8_,
                      CONCAT26(local_3c0._M_allocated_capacity._6_2_,
                               local_3c0._M_allocated_capacity._0_6_) + 1);
    }
    if ((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8 !=
        (TypedObjectWrapper<(glu::ObjectType)1> *)local_3e8) {
      operator_delete(_local_3f8,(ulong)(local_3e8._0_8_ + 1));
    }
    pSVar15 = (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
              ).m_data.ptr;
    if ((pSVar15->m_program).m_info.linkOk == false) {
      pTVar23 = (TestError *)__cxa_allocate_exception(0x38);
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"shader build failed","");
      tcu::TestError::TestError(pTVar23,(string *)local_1c8);
      __cxa_throw(pTVar23,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_useGlobalState == false) {
      local_348 = (ShaderProgram *)operator_new(0xd0);
      pCVar5 = (this->super_TestCase).m_context;
      pRVar6 = pCVar5->m_renderCtx;
      memset(local_1c8,0,0xac);
      local_118._0_8_ = (pointer)0x0;
      local_118[8] = 0;
      local_118._9_7_ = 0;
      local_118[0x10] = 0;
      local_118._17_8_ = 0;
      local_3a8 = &local_398;
      local_3d0._0_8_ = (TestContext *)0x102;
      pCVar18 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)local_3d0);
      uVar7 = local_3d0._0_8_;
      local_398.m_testCtx = (TestContext *)local_3d0._0_8_;
      local_3a8 = pCVar18;
      memcpy(pCVar18,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
             ,0x102);
      local_3a0 = (TestContext *)uVar7;
      *(char *)((long)&pCVar18->m_testCtx + uVar7) = '\0';
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_298,(_anonymous_namespace_ *)pCVar5,local_3a8,pcVar28);
      _local_3f8 = _local_3f8 & 0xffffffff00000000;
      auStack_3f0 = (undefined1  [8])(local_3e8 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_3f0,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c8 + ((ulong)_local_3f8 & 0xffffffff) * 0x18),(value_type *)auStack_3f0
                 );
      pCVar5 = (this->super_TestCase).m_context;
      local_378._16_8_ = local_378 + 0x20;
      local_320 = (pointer)0x81;
      pbVar19 = (pointer)std::__cxx11::string::_M_create
                                   ((ulong *)(local_378 + 0x10),(ulong)&local_320);
      pbVar8 = local_320;
      local_378._32_8_ = local_320;
      local_378._16_8_ = pbVar19;
      memcpy(pbVar19,
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,0x81);
      local_378._24_8_ = pbVar8;
      *(undefined1 *)((long)&(pbVar19->_M_dataplus)._M_p + (long)pbVar8) = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2b8,(_anonymous_namespace_ *)pCVar5,(Context *)local_378._16_8_,pcVar28);
      local_3d0._0_4_ = 1;
      local_3d0._8_8_ = local_3c0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3d0 + 8),local_2b8._M_dataplus._M_p,
                 local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c8 + (local_3d0._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_3d0 + 8));
      pCVar5 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
                ((string *)local_270,&DAT_00000001,setBBox_00);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar5,(Context *)local_270._0_8_,pcVar28);
      local_320 = (pointer)CONCAT44(local_320._4_4_,3);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c8 + ((ulong)local_320 & 0xffffffff) * 0x18),&local_318);
      pCVar5 = (this->super_TestCase).m_context;
      local_398.m_contextInfo = (ContextInfo *)local_378;
      local_278 = (TestContext *)0x1f5;
      pCVar20 = (ContextInfo *)
                std::__cxx11::string::_M_create((ulong *)&local_398.m_contextInfo,(ulong)&local_278)
      ;
      pTVar9 = local_278;
      local_378._0_8_ = local_278;
      local_398.m_contextInfo = pCVar20;
      memcpy(pCVar20,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
             ,0x1f5);
      local_380 = pTVar9;
      *(undefined1 *)((long)&pCVar20->_vptr_ContextInfo + (long)pTVar9) = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2f8,(_anonymous_namespace_ *)pCVar5,(Context *)local_398.m_contextInfo,
                 pcVar28);
      local_250 = 4;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,local_2f8._M_dataplus._M_p,
                 local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
      pSVar15 = local_348;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c8 + (ulong)local_250 * 0x18),&local_248);
      glu::ShaderProgram::ShaderProgram(pSVar15,pRVar6,(ProgramSources *)local_1c8);
      local_218.m_data.ptr = (ShaderProgram *)0x0;
      pMVar2 = &this->m_perPrimitiveProgram;
      if ((this->m_perPrimitiveProgram).
          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr
          != pSVar15) {
        de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                  (&pMVar2->
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
        (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr = local_348;
      }
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_398.m_contextInfo != (ContextInfo *)local_378) {
        operator_delete(local_398.m_contextInfo,(ulong)((long)(Platform **)local_378._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((Context *)local_270._0_8_ != (Context *)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((char *)local_3d0._8_8_ != local_3c0._M_local_buf + 8) {
        operator_delete((void *)local_3d0._8_8_,
                        CONCAT17(local_3c0._M_local_buf[0xf],
                                 CONCAT16(local_3c0._M_local_buf[0xe],local_3c0._8_6_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_378._16_8_ != (pointer)(local_378 + 0x20)) {
        operator_delete((void *)local_378._16_8_,
                        (ulong)((long)&((_Alloc_hider *)local_378._32_8_)->_M_p + 1));
      }
      if (auStack_3f0 != (undefined1  [8])(local_3e8 + 8)) {
        operator_delete((void *)auStack_3f0,local_3e8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_138);
      lVar27 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c8 + lVar27));
        lVar27 = lVar27 + -0x18;
      } while (lVar27 != -0x18);
      pTVar21 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_3d0._0_8_ = (Functions *)0x13;
      _local_3f8 = (pointer)local_3e8;
      _local_3f8 = (pointer)std::__cxx11::string::_M_create((ulong *)local_3f8,(ulong)local_3d0);
      local_3e8._0_8_ = local_3d0._0_8_;
      (((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8)->super_ObjectWrapper).m_gl =
           (Functions *)0x696d697250726550;
      (((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8)->super_ObjectWrapper).m_traits =
           (ObjectTraits *)0x676f725065766974;
      *(undefined4 *)
       ((long)&(((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8)->super_ObjectWrapper).
               m_traits + 7) = 0x6d617267;
      auStack_3f0 = (undefined1  [8])local_3d0._0_8_;
      *(char *)((long)&(((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8)->super_ObjectWrapper)
                       .m_gl + local_3d0._0_8_) = '\0';
      local_320 = (pointer)0x29;
      local_3d0._0_8_ = &local_3c0;
      local_3d0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3d0,(ulong)&local_320);
      local_3c0._M_allocated_capacity._0_6_ = SUB86(local_320,0);
      local_3c0._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_320 >> 0x30);
      *(char *)(local_3d0._0_8_ + 0x19) = 't';
      *(char *)(local_3d0._0_8_ + 0x1a) = 'h';
      *(char *)(local_3d0._0_8_ + 0x1b) = 'e';
      *(char *)(local_3d0._0_8_ + 0x1c) = ' ';
      *(char *)(local_3d0._0_8_ + 0x1d) = 'b';
      *(char *)(local_3d0._0_8_ + 0x1e) = 'o';
      *(char *)(local_3d0._0_8_ + 0x1f) = 'u';
      *(char *)(local_3d0._0_8_ + 0x20) = 'n';
      *(char *)(local_3d0._0_8_ + 0x21) = 'd';
      *(char *)(local_3d0._0_8_ + 0x22) = 'i';
      *(char *)(local_3d0._0_8_ + 0x23) = 'n';
      *(char *)(local_3d0._0_8_ + 0x24) = 'g';
      *(char *)(local_3d0._0_8_ + 0x25) = ' ';
      *(char *)(local_3d0._0_8_ + 0x26) = 'b';
      *(char *)(local_3d0._0_8_ + 0x27) = 'o';
      *(char *)(local_3d0._0_8_ + 0x28) = 'x';
      *(char *)(local_3d0._0_8_ + 0x10) = 'h';
      *(char *)(local_3d0._0_8_ + 0x11) = 'a';
      *(char *)(local_3d0._0_8_ + 0x12) = 't';
      *(char *)(local_3d0._0_8_ + 0x13) = ' ';
      *(char *)(local_3d0._0_8_ + 0x14) = 's';
      *(char *)(local_3d0._0_8_ + 0x15) = 'e';
      *(char *)(local_3d0._0_8_ + 0x16) = 't';
      *(char *)(local_3d0._0_8_ + 0x17) = 's';
      *(char *)(local_3d0._0_8_ + 0x18) = ' ';
      *(char *)(local_3d0._0_8_ + 0x19) = 't';
      *(char *)(local_3d0._0_8_ + 0x1a) = 'h';
      *(char *)(local_3d0._0_8_ + 0x1b) = 'e';
      *(char *)(local_3d0._0_8_ + 0x1c) = ' ';
      *(char *)(local_3d0._0_8_ + 0x1d) = 'b';
      *(char *)(local_3d0._0_8_ + 0x1e) = 'o';
      *(char *)(local_3d0._0_8_ + 0x1f) = 'u';
      *(undefined8 *)local_3d0._0_8_ = 0x7020726564616853;
      *(char *)(local_3d0._0_8_ + 8) = 'r';
      *(char *)(local_3d0._0_8_ + 9) = 'o';
      *(char *)(local_3d0._0_8_ + 10) = 'g';
      *(char *)(local_3d0._0_8_ + 0xb) = 'r';
      *(char *)(local_3d0._0_8_ + 0xc) = 'a';
      *(char *)(local_3d0._0_8_ + 0xd) = 'm';
      *(char *)(local_3d0._0_8_ + 0xe) = ' ';
      *(char *)(local_3d0._0_8_ + 0xf) = 't';
      local_3d0._8_8_ = local_320;
      *(char *)(local_3d0._0_8_ + (long)local_320) = '\0';
      tcu::LogSection::LogSection((LogSection *)local_1c8,(string *)local_3f8,(string *)local_3d0);
      tcu::TestLog::startSection(pTVar21,(char *)local_1c8._0_8_,local_1a8._M_p);
      pTVar21 = glu::operator<<(pTVar21,(pMVar2->
                                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                        ).m_data.ptr);
      tcu::TestLog::endSection(pTVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p != local_198) {
        operator_delete(local_1a8._M_p,(ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._0_8_ != &local_3c0) {
        operator_delete((void *)local_3d0._0_8_,
                        CONCAT26(local_3c0._M_allocated_capacity._6_2_,
                                 local_3c0._M_allocated_capacity._0_6_) + 1);
      }
      if ((TypedObjectWrapper<(glu::ObjectType)1> *)_local_3f8 !=
          (TypedObjectWrapper<(glu::ObjectType)1> *)local_3e8) {
        operator_delete(_local_3f8,(ulong)(local_3e8._0_8_ + 1));
      }
      pSVar15 = (pMVar2->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                m_data.ptr;
      if ((pSVar15->m_program).m_info.linkOk == false) {
        pTVar23 = (TestError *)__cxa_allocate_exception(0x38);
        local_1c8._0_8_ = &local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"shader build failed","");
        tcu::TestError::TestError(pTVar23,(string *)local_1c8);
        __cxa_throw(pTVar23,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return (int)pSVar15;
}

Assistant:

void ClearCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_drawTriangles && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Doing multiple"
			<< ((m_scissoredClear) ? (" scissored") : (""))
			<< " color buffer clears"
			<< ((m_drawTriangles) ? (" and drawing some geometry between them") : (""))
			<< ".\n"
		<< ((m_scissoredClear && m_fullscreenScissor) ? ("Setting scissor area to cover entire viewport.\n") : (""))
		<< "Rendering with and without setting the bounding box.\n"
		<< "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< ".\n"
		<< "Clear color is green with yellowish shades.\n"
		<< ((m_drawTriangles) ? ("Primitive color is yellow with greenish shades.\n") : (""))
		<< tcu::TestLog::EndMessage;

	if (m_drawTriangles)
	{
		createVbo();
		createProgram();
	}
}